

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_md5.cpp
# Opt level: O3

ON_MD5_Hash ON_MD5_Hash::FileHash(wchar_t *filename,ON__UINT64 *sizeof_file)

{
  FILE *file;
  ON_MD5_Hash OVar1;
  
  if ((filename == (wchar_t *)0x0) || (*filename == L'\0')) {
    file = (FILE *)0x0;
  }
  else {
    file = ON_FileStream::Open(filename,L"rb");
  }
  OVar1 = FileHash(file,sizeof_file);
  ON_FileStream::Close(file);
  return (ON_MD5_Hash)OVar1.m_digest;
}

Assistant:

ON_MD5_Hash ON_MD5_Hash::FileHash(
  const wchar_t* filename,
  ON__UINT64& sizeof_file
  )
{
  FILE* fp = 
    ( nullptr == filename ||  0 == filename[0] )
    ? nullptr
    : ON_FileStream::Open(filename, L"rb");
  ON_MD5_Hash md5_hash = ON_MD5_Hash::FileHash(fp,sizeof_file);
  ON_FileStream::Close(fp);
  return md5_hash;
}